

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  void **in_RSI;
  long in_RDI;
  bool bVar2;
  int axis;
  int i;
  int *axes_ptr;
  bool _squeeze_c;
  bool _squeeze_h;
  bool _squeeze_w;
  int dims;
  int channels;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff5d8;
  void **ppvVar3;
  int _h;
  undefined8 in_stack_fffffffffffff5e0;
  int iVar4;
  Mat *in_stack_fffffffffffff5e8;
  void **ppvVar5;
  bool local_91b;
  bool local_91a;
  bool local_919;
  void *local_900;
  int *local_8f8;
  long *local_8e0;
  void *local_8b8;
  int *local_8b0;
  long *local_898;
  void *local_870;
  int *local_868;
  long *local_850;
  void *local_828;
  int *local_820;
  long *local_808;
  void *local_7e0;
  int *local_7d8;
  long *local_7c0;
  void *local_798;
  int *local_790;
  long *local_778;
  void *local_750;
  int *local_748;
  long *local_730;
  void *local_708;
  int *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long *local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  void *local_6c0;
  int *local_6b8;
  undefined8 local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined8 local_680;
  void *local_678;
  int *local_670;
  undefined8 local_668;
  undefined4 local_660;
  long *local_658;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined8 local_638;
  void *local_620;
  int *local_618;
  undefined8 local_610;
  undefined4 local_608;
  long *local_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined8 local_5e0;
  int local_5d8;
  int local_5d4;
  long local_5d0;
  bool local_5c3;
  bool local_5c2;
  bool local_5c1;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  void **local_5a8;
  int local_58c;
  int local_588;
  undefined4 local_584;
  void **local_580;
  void **local_578;
  int local_568;
  undefined4 local_564;
  void **local_560;
  void **local_558;
  int local_548;
  undefined4 local_544;
  void **local_540;
  void **local_538;
  int local_528;
  undefined4 local_524;
  void **local_520;
  void **local_518;
  int local_508;
  undefined4 local_504;
  void **local_500;
  void **local_4f8;
  int local_4e8;
  undefined4 local_4e4;
  void **local_4e0;
  void **local_4d8;
  int local_4c8;
  undefined4 local_4c4;
  void **local_4c0;
  void **local_4b8;
  int local_4a8;
  undefined4 local_4a4;
  void **local_4a0;
  void **local_498;
  int local_488;
  undefined4 local_484;
  void **local_480;
  void **local_478;
  int local_468;
  undefined4 local_464;
  void **local_460;
  void **local_458;
  int local_448;
  undefined4 local_444;
  void **local_440;
  void **local_438;
  int local_428;
  undefined4 local_424;
  void **local_420;
  void **local_408;
  void **local_3f8;
  void **local_3e8;
  void **local_3d8;
  void **local_3c8;
  void **local_3b8;
  void **local_3a8;
  void **local_398;
  void **local_388;
  void **local_378;
  void **local_368;
  long *local_350;
  long *local_348;
  int local_330;
  undefined4 local_32c;
  void **local_328;
  int local_310;
  undefined4 local_30c;
  void **local_308;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  int local_2d0;
  undefined4 local_2cc;
  void **local_2c8;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  int local_290;
  undefined4 local_28c;
  void **local_288;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  int local_250;
  undefined4 local_24c;
  void **local_248;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  int local_1e0;
  undefined4 local_1dc;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1c0;
  undefined4 local_1bc;
  void **local_1b8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  int local_190;
  undefined4 local_18c;
  void **local_188;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_130;
  undefined4 local_12c;
  void **local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  long *local_10;
  
  local_5b4 = *(int *)((long)in_RSI + 0x2c);
  local_5b8 = *(int *)(in_RSI + 6);
  local_5bc = *(int *)(in_RSI + 7);
  local_5c0 = *(int *)(in_RSI + 5);
  local_5c1 = false;
  local_5c2 = false;
  local_5c3 = false;
  local_350 = (long *)(in_RDI + 0xe0);
  bVar2 = true;
  if (*local_350 != 0) {
    bVar2 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
    local_10 = local_350;
  }
  if (bVar2) {
    local_919 = false;
    if (local_5b4 == 1) {
      local_919 = *(int *)(in_RDI + 0xd0) != 0;
    }
    local_5c1 = local_919;
    local_91a = false;
    if (local_5b8 == 1) {
      local_91a = *(int *)(in_RDI + 0xd4) != 0;
    }
    local_5c2 = local_91a;
    local_91b = false;
    if (local_5bc == 1) {
      local_91b = *(int *)(in_RDI + 0xd8) != 0;
    }
    local_5c3 = local_91b;
  }
  else {
    local_348 = (long *)(in_RDI + 0xe0);
    local_5d0 = *local_348;
    for (local_5d4 = 0; local_5d4 < *(int *)(in_RDI + 0x10c); local_5d4 = local_5d4 + 1) {
      local_5d8 = *(int *)(local_5d0 + (long)local_5d4 * 4);
      if (local_5d8 < 0) {
        local_5d8 = local_5c0 + local_5d8;
      }
      if ((local_5c0 == 1) && (local_5d8 == 0)) {
        local_5c1 = local_5b4 == 1;
      }
      if ((local_5c0 == 2) && (local_5d8 == 0)) {
        local_5c2 = local_5b8 == 1;
      }
      if ((local_5c0 == 2) && (local_5d8 == 1)) {
        local_5c1 = local_5b4 == 1;
      }
      if ((local_5c0 == 3) && (local_5d8 == 0)) {
        local_5c3 = local_5bc == 1;
      }
      if ((local_5c0 == 3) && (local_5d8 == 1)) {
        local_5c2 = local_5b8 == 1;
      }
      if ((local_5c0 == 3) && (local_5d8 == 2)) {
        local_5c1 = local_5b4 == 1;
      }
    }
  }
  local_5a8 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != (void *)0x0) {
      piVar1 = (int *)in_RSI[1];
      local_424 = 1;
      LOCK();
      local_428 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_420 = in_RSI;
    if (in_RDX[1] != (void *)0x0) {
      piVar1 = (int *)in_RDX[1];
      local_1dc = 0xffffffff;
      LOCK();
      local_1e0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_1e0 == 1) {
        if (in_RDX[4] == (void *)0x0) {
          local_c8 = *in_RDX;
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = (void *)0x0;
    in_RDX[2] = (void *)0x0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = (void *)0x0;
    in_RDX[1] = (void *)0x0;
    *in_RDX = *local_420;
    in_RDX[1] = local_420[1];
    in_RDX[2] = local_420[2];
    *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(local_420 + 3);
    in_RDX[4] = local_420[4];
    *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(local_420 + 5);
    *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_420 + 0x2c);
    *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(local_420 + 6);
    *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_420 + 0x34);
    *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(local_420 + 7);
    in_RDX[8] = local_420[8];
  }
  if ((local_5c0 == 1) && ((local_5c1 & 1U) != 0)) {
    Mat::reshape(in_stack_fffffffffffff5e8,(int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                 in_stack_fffffffffffff5d8);
    ppvVar3 = local_5a8;
    local_438 = local_5a8;
    local_440 = &local_620;
    if (local_5a8 != local_440) {
      if (local_618 != (int *)0x0) {
        local_444 = 1;
        LOCK();
        local_448 = *local_618;
        *local_618 = *local_618 + 1;
        UNLOCK();
      }
      local_1c8 = local_5a8;
      if (local_5a8[1] != (void *)0x0) {
        piVar1 = (int *)local_5a8[1];
        local_1cc = 0xffffffff;
        LOCK();
        local_1d0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_1d0 == 1) {
          if (local_5a8[4] == (void *)0x0) {
            local_d0 = *local_5a8;
            if (local_d0 != (void *)0x0) {
              free(local_d0);
            }
          }
          else {
            (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
      *ppvVar3 = *local_440;
      ppvVar3[1] = local_440[1];
      ppvVar3[2] = local_440[2];
      *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_440 + 3);
      ppvVar3[4] = local_440[4];
      *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_440 + 5);
      *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_440 + 0x2c);
      *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_440 + 6);
      *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_440 + 0x34);
      *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_440 + 7);
      ppvVar3[8] = local_440[8];
    }
    local_408 = &local_620;
    local_1e8 = local_408;
    if (local_618 != (int *)0x0) {
      local_1ec = 0xffffffff;
      LOCK();
      local_1f0 = *local_618;
      *local_618 = *local_618 + -1;
      UNLOCK();
      if (local_1f0 == 1) {
        if (local_600 == (long *)0x0) {
          if (local_620 != (void *)0x0) {
            free(local_620);
          }
        }
        else {
          (**(code **)(*local_600 + 0x18))(local_600,local_620);
        }
      }
    }
    local_620 = (void *)0x0;
    local_610 = 0;
    local_608 = 0;
    local_5f8 = 0;
    local_5f4 = 0;
    local_5f0 = 0;
    local_5ec = 0;
    local_5e8 = 0;
    local_5e0 = 0;
    local_618 = (int *)0x0;
  }
  if (local_5c0 == 2) {
    iVar4 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
    if (((local_5c1 & 1U) == 0) || ((local_5c2 & 1U) == 0)) {
      if ((local_5c1 & 1U) == 0) {
        if ((local_5c2 & 1U) != 0) {
          Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
          ppvVar3 = local_5a8;
          local_498 = local_5a8;
          local_4a0 = &local_708;
          if (local_5a8 != local_4a0) {
            if (local_700 != (int *)0x0) {
              local_4a4 = 1;
              LOCK();
              local_4a8 = *local_700;
              *local_700 = *local_700 + 1;
              UNLOCK();
            }
            local_198 = local_5a8;
            if (local_5a8[1] != (void *)0x0) {
              piVar1 = (int *)local_5a8[1];
              local_19c = 0xffffffff;
              LOCK();
              local_1a0 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_1a0 == 1) {
                if (local_5a8[4] == (void *)0x0) {
                  local_e8 = *local_5a8;
                  if (local_e8 != (void *)0x0) {
                    free(local_e8);
                  }
                }
                else {
                  (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_4a0;
            ppvVar3[1] = local_4a0[1];
            ppvVar3[2] = local_4a0[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_4a0 + 3);
            ppvVar3[4] = local_4a0[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_4a0 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_4a0 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_4a0 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_4a0 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_4a0 + 7);
            ppvVar3[8] = local_4a0[8];
          }
          local_3d8 = &local_708;
          local_248 = local_3d8;
          if (local_700 != (int *)0x0) {
            local_24c = 0xffffffff;
            LOCK();
            local_250 = *local_700;
            *local_700 = *local_700 + -1;
            UNLOCK();
            if (local_250 == 1) {
              if (local_6e8 == (long *)0x0) {
                if (local_708 != (void *)0x0) {
                  free(local_708);
                }
              }
              else {
                (**(code **)(*local_6e8 + 0x18))(local_6e8,local_708);
              }
            }
          }
          local_708 = (void *)0x0;
          local_6f8 = 0;
          local_6f0 = 0;
          local_6e0 = 0;
          local_6dc = 0;
          local_6d8 = 0;
          local_6d4 = 0;
          local_6d0 = 0;
          local_6c8 = 0;
          local_700 = (int *)0x0;
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
        ppvVar3 = local_5a8;
        local_478 = local_5a8;
        local_480 = &local_6c0;
        if (local_5a8 != local_480) {
          if (local_6b8 != (int *)0x0) {
            local_484 = 1;
            LOCK();
            local_488 = *local_6b8;
            *local_6b8 = *local_6b8 + 1;
            UNLOCK();
          }
          local_1a8 = local_5a8;
          if (local_5a8[1] != (void *)0x0) {
            piVar1 = (int *)local_5a8[1];
            local_1ac = 0xffffffff;
            LOCK();
            local_1b0 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_1b0 == 1) {
              if (local_5a8[4] == (void *)0x0) {
                local_e0 = *local_5a8;
                if (local_e0 != (void *)0x0) {
                  free(local_e0);
                }
              }
              else {
                (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_480;
          ppvVar3[1] = local_480[1];
          ppvVar3[2] = local_480[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_480 + 3);
          ppvVar3[4] = local_480[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_480 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_480 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_480 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_480 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_480 + 7);
          ppvVar3[8] = local_480[8];
        }
        local_3e8 = &local_6c0;
        local_228 = local_3e8;
        if (local_6b8 != (int *)0x0) {
          local_22c = 0xffffffff;
          LOCK();
          local_230 = *local_6b8;
          *local_6b8 = *local_6b8 + -1;
          UNLOCK();
          if (local_230 == 1) {
            if (local_6a0 == (long *)0x0) {
              if (local_6c0 != (void *)0x0) {
                free(local_6c0);
              }
            }
            else {
              (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
            }
          }
        }
        local_6c0 = (void *)0x0;
        local_6b0 = 0;
        local_6a8 = 0;
        local_698 = 0;
        local_694 = 0;
        local_690 = 0;
        local_68c = 0;
        local_688 = 0;
        local_680 = 0;
        local_6b8 = (int *)0x0;
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
      ppvVar3 = local_5a8;
      local_458 = local_5a8;
      local_460 = &local_678;
      if (local_5a8 != local_460) {
        if (local_670 != (int *)0x0) {
          local_464 = 1;
          LOCK();
          local_468 = *local_670;
          *local_670 = *local_670 + 1;
          UNLOCK();
        }
        local_1b8 = local_5a8;
        if (local_5a8[1] != (void *)0x0) {
          piVar1 = (int *)local_5a8[1];
          local_1bc = 0xffffffff;
          LOCK();
          local_1c0 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1c0 == 1) {
            if (local_5a8[4] == (void *)0x0) {
              local_d8 = *local_5a8;
              if (local_d8 != (void *)0x0) {
                free(local_d8);
              }
            }
            else {
              (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_460;
        ppvVar3[1] = local_460[1];
        ppvVar3[2] = local_460[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_460 + 3);
        ppvVar3[4] = local_460[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_460 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_460 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_460 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_460 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_460 + 7);
        ppvVar3[8] = local_460[8];
      }
      local_3f8 = &local_678;
      local_208 = local_3f8;
      if (local_670 != (int *)0x0) {
        local_20c = 0xffffffff;
        LOCK();
        local_210 = *local_670;
        *local_670 = *local_670 + -1;
        UNLOCK();
        if (local_210 == 1) {
          if (local_658 == (long *)0x0) {
            if (local_678 != (void *)0x0) {
              free(local_678);
            }
          }
          else {
            (**(code **)(*local_658 + 0x18))(local_658,local_678);
          }
        }
      }
      local_678 = (void *)0x0;
      local_668 = 0;
      local_660 = 0;
      local_650 = 0;
      local_64c = 0;
      local_648 = 0;
      local_644 = 0;
      local_640 = 0;
      local_638 = 0;
      local_670 = (int *)0x0;
    }
  }
  if (local_5c0 == 3) {
    iVar4 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
    if ((((local_5c1 & 1U) == 0) || ((local_5c2 & 1U) == 0)) || ((local_5c3 & 1U) == 0)) {
      if (((local_5c1 & 1U) == 0) || ((local_5c2 & 1U) == 0)) {
        if (((local_5c2 & 1U) == 0) || ((local_5c3 & 1U) == 0)) {
          if (((local_5c1 & 1U) == 0) || ((local_5c3 & 1U) == 0)) {
            _h = (int)in_stack_fffffffffffff5e0;
            if ((local_5c1 & 1U) == 0) {
              if ((local_5c2 & 1U) == 0) {
                if ((local_5c3 & 1U) != 0) {
                  Mat::reshape(in_stack_fffffffffffff5e8,iVar4,_h,in_stack_fffffffffffff5d8);
                  ppvVar3 = local_5a8;
                  local_578 = local_5a8;
                  local_580 = &local_900;
                  if (local_5a8 != local_580) {
                    if (local_8f8 != (int *)0x0) {
                      local_584 = 1;
                      LOCK();
                      local_588 = *local_8f8;
                      *local_8f8 = *local_8f8 + 1;
                      UNLOCK();
                    }
                    local_128 = local_5a8;
                    if (local_5a8[1] != (void *)0x0) {
                      piVar1 = (int *)local_5a8[1];
                      local_12c = 0xffffffff;
                      LOCK();
                      local_130 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_130 == 1) {
                        if (local_5a8[4] == (void *)0x0) {
                          local_120 = *local_5a8;
                          if (local_120 != (void *)0x0) {
                            free(local_120);
                          }
                        }
                        else {
                          (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                        }
                      }
                    }
                    *ppvVar3 = (void *)0x0;
                    ppvVar3[2] = (void *)0x0;
                    *(undefined4 *)(ppvVar3 + 3) = 0;
                    *(undefined4 *)(ppvVar3 + 5) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                    *(undefined4 *)(ppvVar3 + 6) = 0;
                    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                    *(undefined4 *)(ppvVar3 + 7) = 0;
                    ppvVar3[8] = (void *)0x0;
                    ppvVar3[1] = (void *)0x0;
                    *ppvVar3 = *local_580;
                    ppvVar3[1] = local_580[1];
                    ppvVar3[2] = local_580[2];
                    *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_580 + 3);
                    ppvVar3[4] = local_580[4];
                    *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_580 + 5);
                    *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_580 + 0x2c);
                    *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_580 + 6);
                    *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_580 + 0x34);
                    *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_580 + 7);
                    ppvVar3[8] = local_580[8];
                  }
                  local_368 = &local_900;
                  if (local_8f8 != (int *)0x0) {
                    local_32c = 0xffffffff;
                    LOCK();
                    local_330 = *local_8f8;
                    *local_8f8 = *local_8f8 + -1;
                    UNLOCK();
                    if (local_330 == 1) {
                      local_328 = local_368;
                      if (local_8e0 == (long *)0x0) {
                        if (local_900 != (void *)0x0) {
                          free(local_900);
                        }
                      }
                      else {
                        (**(code **)(*local_8e0 + 0x18))(local_8e0,local_900);
                      }
                    }
                  }
                }
              }
              else {
                Mat::reshape(in_stack_fffffffffffff5e8,iVar4,_h,in_stack_fffffffffffff5d8);
                ppvVar3 = local_5a8;
                local_558 = local_5a8;
                local_560 = &local_8b8;
                if (local_5a8 != local_560) {
                  if (local_8b0 != (int *)0x0) {
                    local_564 = 1;
                    LOCK();
                    local_568 = *local_8b0;
                    *local_8b0 = *local_8b0 + 1;
                    UNLOCK();
                  }
                  local_138 = local_5a8;
                  if (local_5a8[1] != (void *)0x0) {
                    piVar1 = (int *)local_5a8[1];
                    local_13c = 0xffffffff;
                    LOCK();
                    local_140 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_140 == 1) {
                      if (local_5a8[4] == (void *)0x0) {
                        local_118 = *local_5a8;
                        if (local_118 != (void *)0x0) {
                          free(local_118);
                        }
                      }
                      else {
                        (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                      }
                    }
                  }
                  *ppvVar3 = (void *)0x0;
                  ppvVar3[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar3 + 3) = 0;
                  *(undefined4 *)(ppvVar3 + 5) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar3 + 6) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                  *(undefined4 *)(ppvVar3 + 7) = 0;
                  ppvVar3[8] = (void *)0x0;
                  ppvVar3[1] = (void *)0x0;
                  *ppvVar3 = *local_560;
                  ppvVar3[1] = local_560[1];
                  ppvVar3[2] = local_560[2];
                  *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_560 + 3);
                  ppvVar3[4] = local_560[4];
                  *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_560 + 5);
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_560 + 0x2c);
                  *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_560 + 6);
                  *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_560 + 0x34);
                  *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_560 + 7);
                  ppvVar3[8] = local_560[8];
                }
                local_378 = &local_8b8;
                if (local_8b0 != (int *)0x0) {
                  local_30c = 0xffffffff;
                  LOCK();
                  local_310 = *local_8b0;
                  *local_8b0 = *local_8b0 + -1;
                  UNLOCK();
                  if (local_310 == 1) {
                    local_308 = local_378;
                    if (local_898 == (long *)0x0) {
                      if (local_8b8 != (void *)0x0) {
                        free(local_8b8);
                      }
                    }
                    else {
                      (**(code **)(*local_898 + 0x18))(local_898,local_8b8);
                    }
                  }
                }
              }
            }
            else {
              Mat::reshape(in_stack_fffffffffffff5e8,iVar4,_h,in_stack_fffffffffffff5d8);
              ppvVar3 = local_5a8;
              local_538 = local_5a8;
              local_540 = &local_870;
              if (local_5a8 != local_540) {
                if (local_868 != (int *)0x0) {
                  local_544 = 1;
                  LOCK();
                  local_548 = *local_868;
                  *local_868 = *local_868 + 1;
                  UNLOCK();
                }
                local_148 = local_5a8;
                if (local_5a8[1] != (void *)0x0) {
                  piVar1 = (int *)local_5a8[1];
                  local_14c = 0xffffffff;
                  LOCK();
                  local_150 = *piVar1;
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (local_150 == 1) {
                    if (local_5a8[4] == (void *)0x0) {
                      local_110 = *local_5a8;
                      if (local_110 != (void *)0x0) {
                        free(local_110);
                      }
                    }
                    else {
                      (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                    }
                  }
                }
                *ppvVar3 = (void *)0x0;
                ppvVar3[2] = (void *)0x0;
                *(undefined4 *)(ppvVar3 + 3) = 0;
                *(undefined4 *)(ppvVar3 + 5) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                *(undefined4 *)(ppvVar3 + 6) = 0;
                *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                *(undefined4 *)(ppvVar3 + 7) = 0;
                ppvVar3[8] = (void *)0x0;
                ppvVar3[1] = (void *)0x0;
                *ppvVar3 = *local_540;
                ppvVar3[1] = local_540[1];
                ppvVar3[2] = local_540[2];
                *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_540 + 3);
                ppvVar3[4] = local_540[4];
                *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_540 + 5);
                *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_540 + 0x2c);
                *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_540 + 6);
                *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_540 + 0x34);
                *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_540 + 7);
                ppvVar3[8] = local_540[8];
              }
              local_388 = &local_870;
              if (local_868 != (int *)0x0) {
                local_2ec = 0xffffffff;
                LOCK();
                local_2f0 = *local_868;
                *local_868 = *local_868 + -1;
                UNLOCK();
                if (local_2f0 == 1) {
                  local_2e8 = local_388;
                  if (local_850 == (long *)0x0) {
                    if (local_870 != (void *)0x0) {
                      free(local_870);
                    }
                  }
                  else {
                    (**(code **)(*local_850 + 0x18))(local_850,local_870);
                  }
                }
              }
            }
          }
          else {
            Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
            local_518 = local_5a8;
            local_520 = &local_828;
            if (local_5a8 != local_520) {
              if (local_820 != (int *)0x0) {
                local_524 = 1;
                LOCK();
                local_528 = *local_820;
                *local_820 = *local_820 + 1;
                UNLOCK();
              }
              local_158 = local_5a8;
              ppvVar3 = local_5a8;
              ppvVar5 = local_5a8;
              if (local_5a8[1] != (void *)0x0) {
                piVar1 = (int *)local_5a8[1];
                local_15c = 0xffffffff;
                LOCK();
                local_160 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_160 == 1) {
                  if (local_5a8[4] == (void *)0x0) {
                    local_108 = *local_5a8;
                    if (local_108 != (void *)0x0) {
                      free(local_108);
                    }
                  }
                  else {
                    (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                  }
                }
              }
              *ppvVar3 = (void *)0x0;
              ppvVar3[2] = (void *)0x0;
              *(undefined4 *)(ppvVar3 + 3) = 0;
              *(undefined4 *)(ppvVar3 + 5) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
              *(undefined4 *)(ppvVar3 + 6) = 0;
              *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
              *(undefined4 *)(ppvVar3 + 7) = 0;
              ppvVar3[8] = (void *)0x0;
              ppvVar3[1] = (void *)0x0;
              *ppvVar5 = *local_520;
              ppvVar5[1] = local_520[1];
              ppvVar5[2] = local_520[2];
              *(undefined4 *)(ppvVar5 + 3) = *(undefined4 *)(local_520 + 3);
              ppvVar5[4] = local_520[4];
              *(undefined4 *)(ppvVar5 + 5) = *(undefined4 *)(local_520 + 5);
              *(undefined4 *)((long)ppvVar5 + 0x2c) = *(undefined4 *)((long)local_520 + 0x2c);
              *(undefined4 *)(ppvVar5 + 6) = *(undefined4 *)(local_520 + 6);
              *(undefined4 *)((long)ppvVar5 + 0x34) = *(undefined4 *)((long)local_520 + 0x34);
              *(undefined4 *)(ppvVar5 + 7) = *(undefined4 *)(local_520 + 7);
              ppvVar5[8] = local_520[8];
            }
            ppvVar3 = &local_828;
            if (local_820 != (int *)0x0) {
              local_2cc = 0xffffffff;
              LOCK();
              local_2d0 = *local_820;
              *local_820 = *local_820 + -1;
              UNLOCK();
              if (local_2d0 == 1) {
                local_398 = ppvVar3;
                local_2c8 = ppvVar3;
                if (local_808 == (long *)0x0) {
                  if (local_828 != (void *)0x0) {
                    free(local_828);
                  }
                }
                else {
                  (**(code **)(*local_808 + 0x18))(local_808,local_828);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
          }
        }
        else {
          Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
          ppvVar3 = local_5a8;
          local_4f8 = local_5a8;
          local_500 = &local_7e0;
          if (local_5a8 != local_500) {
            if (local_7d8 != (int *)0x0) {
              local_504 = 1;
              LOCK();
              local_508 = *local_7d8;
              *local_7d8 = *local_7d8 + 1;
              UNLOCK();
            }
            local_168 = local_5a8;
            if (local_5a8[1] != (void *)0x0) {
              piVar1 = (int *)local_5a8[1];
              local_16c = 0xffffffff;
              LOCK();
              local_170 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_170 == 1) {
                if (local_5a8[4] == (void *)0x0) {
                  local_100 = *local_5a8;
                  if (local_100 != (void *)0x0) {
                    free(local_100);
                  }
                }
                else {
                  (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            ppvVar3[2] = (void *)0x0;
            *(undefined4 *)(ppvVar3 + 3) = 0;
            *(undefined4 *)(ppvVar3 + 5) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
            *(undefined4 *)(ppvVar3 + 6) = 0;
            *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
            *(undefined4 *)(ppvVar3 + 7) = 0;
            ppvVar3[8] = (void *)0x0;
            ppvVar3[1] = (void *)0x0;
            *ppvVar3 = *local_500;
            ppvVar3[1] = local_500[1];
            ppvVar3[2] = local_500[2];
            *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_500 + 3);
            ppvVar3[4] = local_500[4];
            *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_500 + 5);
            *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_500 + 0x2c);
            *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_500 + 6);
            *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_500 + 0x34);
            *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_500 + 7);
            ppvVar3[8] = local_500[8];
          }
          local_3a8 = &local_7e0;
          if (local_7d8 != (int *)0x0) {
            local_2ac = 0xffffffff;
            LOCK();
            local_2b0 = *local_7d8;
            *local_7d8 = *local_7d8 + -1;
            UNLOCK();
            if (local_2b0 == 1) {
              local_2a8 = local_3a8;
              if (local_7c0 == (long *)0x0) {
                if (local_7e0 != (void *)0x0) {
                  free(local_7e0);
                }
              }
              else {
                (**(code **)(*local_7c0 + 0x18))(local_7c0,local_7e0);
              }
            }
          }
        }
      }
      else {
        Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
        ppvVar3 = local_5a8;
        local_4d8 = local_5a8;
        local_4e0 = &local_798;
        if (local_5a8 != local_4e0) {
          if (local_790 != (int *)0x0) {
            local_4e4 = 1;
            LOCK();
            local_4e8 = *local_790;
            *local_790 = *local_790 + 1;
            UNLOCK();
          }
          local_178 = local_5a8;
          if (local_5a8[1] != (void *)0x0) {
            piVar1 = (int *)local_5a8[1];
            local_17c = 0xffffffff;
            LOCK();
            local_180 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_180 == 1) {
              if (local_5a8[4] == (void *)0x0) {
                local_f8 = *local_5a8;
                if (local_f8 != (void *)0x0) {
                  free(local_f8);
                }
              }
              else {
                (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar3 = *local_4e0;
          ppvVar3[1] = local_4e0[1];
          ppvVar3[2] = local_4e0[2];
          *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_4e0 + 3);
          ppvVar3[4] = local_4e0[4];
          *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_4e0 + 5);
          *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_4e0 + 0x2c);
          *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_4e0 + 6);
          *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_4e0 + 0x34);
          *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_4e0 + 7);
          ppvVar3[8] = local_4e0[8];
        }
        local_3b8 = &local_798;
        if (local_790 != (int *)0x0) {
          local_28c = 0xffffffff;
          LOCK();
          local_290 = *local_790;
          *local_790 = *local_790 + -1;
          UNLOCK();
          if (local_290 == 1) {
            local_288 = local_3b8;
            if (local_778 == (long *)0x0) {
              if (local_798 != (void *)0x0) {
                free(local_798);
              }
            }
            else {
              (**(code **)(*local_778 + 0x18))(local_778,local_798);
            }
          }
        }
      }
    }
    else {
      Mat::reshape(in_stack_fffffffffffff5e8,iVar4,in_stack_fffffffffffff5d8);
      ppvVar3 = local_5a8;
      local_4b8 = local_5a8;
      local_4c0 = &local_750;
      if (local_5a8 != local_4c0) {
        if (local_748 != (int *)0x0) {
          local_4c4 = 1;
          LOCK();
          local_4c8 = *local_748;
          *local_748 = *local_748 + 1;
          UNLOCK();
        }
        local_188 = local_5a8;
        if (local_5a8[1] != (void *)0x0) {
          piVar1 = (int *)local_5a8[1];
          local_18c = 0xffffffff;
          LOCK();
          local_190 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_190 == 1) {
            if (local_5a8[4] == (void *)0x0) {
              local_f0 = *local_5a8;
              if (local_f0 != (void *)0x0) {
                free(local_f0);
              }
            }
            else {
              (**(code **)(*local_5a8[4] + 0x18))(local_5a8[4],*local_5a8);
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        ppvVar3[2] = (void *)0x0;
        *(undefined4 *)(ppvVar3 + 3) = 0;
        *(undefined4 *)(ppvVar3 + 5) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
        *(undefined4 *)(ppvVar3 + 6) = 0;
        *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
        *(undefined4 *)(ppvVar3 + 7) = 0;
        ppvVar3[8] = (void *)0x0;
        ppvVar3[1] = (void *)0x0;
        *ppvVar3 = *local_4c0;
        ppvVar3[1] = local_4c0[1];
        ppvVar3[2] = local_4c0[2];
        *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_4c0 + 3);
        ppvVar3[4] = local_4c0[4];
        *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_4c0 + 5);
        *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_4c0 + 0x2c);
        *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_4c0 + 6);
        *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_4c0 + 0x34);
        *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_4c0 + 7);
        ppvVar3[8] = local_4c0[8];
      }
      local_3c8 = &local_750;
      if (local_748 != (int *)0x0) {
        local_26c = 0xffffffff;
        LOCK();
        local_270 = *local_748;
        *local_748 = *local_748 + -1;
        UNLOCK();
        if (local_270 == 1) {
          local_268 = local_3c8;
          if (local_730 == (long *)0x0) {
            if (local_750 != (void *)0x0) {
              free(local_750);
            }
          }
          else {
            (**(code **)(*local_730 + 0x18))(local_730,local_750);
          }
        }
      }
    }
  }
  bVar2 = true;
  if (*local_5a8 != (void *)0x0) {
    bVar2 = (long)local_5a8[8] * (long)*(int *)(local_5a8 + 7) == 0;
  }
  if (bVar2) {
    local_58c = -100;
  }
  else {
    local_58c = 0;
  }
  return local_58c;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}